

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qproxystyle.cpp
# Opt level: O2

int __thiscall
QProxyStyle::pixelMetric(QProxyStyle *this,PixelMetric metric,QStyleOption *option,QWidget *widget)

{
  QProxyStylePrivate *this_00;
  QObject *pQVar1;
  int iVar2;
  
  this_00 = *(QProxyStylePrivate **)&(this->super_QCommonStyle).super_QStyle.field_0x8;
  QProxyStylePrivate::ensureBaseStyle(this_00);
  pQVar1 = (this_00->baseStyle).wp.value;
  iVar2 = (**(code **)(*(long *)pQVar1 + 0xe0))(pQVar1,metric,option,widget);
  return iVar2;
}

Assistant:

int QProxyStyle::pixelMetric(PixelMetric metric, const QStyleOption *option, const QWidget *widget) const
{
    Q_D (const QProxyStyle);
    d->ensureBaseStyle();
    return d->baseStyle->pixelMetric(metric, option, widget);
}